

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O2

void __thiscall
webfront::http::std::experimental::net::v1::detail::
op_queue<std::experimental::net::v1::detail::reactor_op>::pop
          (op_queue<std::experimental::net::v1::detail::reactor_op> *this)

{
  reactor_op *prVar1;
  reactor_op *prVar2;
  reactor_op *tmp;
  
  prVar1 = this->front_;
  if (prVar1 != (reactor_op *)0x0) {
    prVar2 = (reactor_op *)(prVar1->super_operation).next_;
    this->front_ = prVar2;
    if (prVar2 == (reactor_op *)0x0) {
      this->back_ = (reactor_op *)0x0;
    }
    (prVar1->super_operation).next_ = (scheduler_operation *)0x0;
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }